

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::SIMDPFor::decodeArray
          (SIMDPFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t *in_00;
  ulong uVar3;
  size_t sVar4;
  size_t thisnvalue;
  size_t local_38;
  
  uVar1 = *in;
  puVar2 = in + 1;
  *nvalue = (ulong)uVar1;
  in_00 = puVar2;
  if ((ulong)uVar1 != 0) {
    uVar3 = *nvalue;
    if (uVar3 == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = 0;
      do {
        local_38 = uVar3 - sVar4;
        in_00 = __decodeArray(this,in_00,(long)((long)puVar2 + (len * 4 - (long)in_00)) >> 2,out,
                              &local_38);
        out = out + local_38;
        sVar4 = sVar4 + local_38;
        uVar3 = *nvalue;
      } while (sVar4 < uVar3);
    }
    *nvalue = sVar4;
  }
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t len,
                              uint32_t *out, size_t &nvalue) override {
    nvalue = *in++;
    if (nvalue == 0)
      return in;
#ifndef NDEBUG
    const uint32_t *const initin = in;
#endif
    const uint32_t *const finalin = in + len;
    size_t totalnvalue(0);
    while (totalnvalue < nvalue) {
      size_t thisnvalue = nvalue - totalnvalue;
#ifndef NDEBUG
      const uint32_t *const befin(in);
#endif
      assert(finalin <= len + in);
      in = __decodeArray(in, finalin - in, out, thisnvalue);
      assert(in > befin);
      assert(in <= finalin);
      out += thisnvalue;
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
    }
    assert(in <= len + initin);
    assert(in <= finalin);
    nvalue = totalnvalue;
    return in;
  }